

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

bool __thiscall Company::isEnoughBudget(Company *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  iVar1 = Boss::getNumberOfEmployee(this->boss);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  else {
    lVar3 = 0;
    iVar1 = 0;
    do {
      dVar4 = Employee::calculateSalary(this->employee[lVar3]);
      iVar1 = (int)((double)iVar1 + dVar4);
      lVar3 = lVar3 + 1;
      iVar2 = Boss::getNumberOfEmployee(this->boss);
    } while (lVar3 < iVar2);
  }
  return iVar1 <= this->budget;
}

Assistant:

bool Company::isEnoughBudget() {

    bool flag = false;
    int sum = 0;
    for (int j = 0; j < boss->getNumberOfEmployee(); j++) {
        sum += employee[j]->calculateSalary();
    }
    if(sum <= budget)
        flag = true;
    return flag;
}